

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ICUTransService.cpp
# Opt level: O2

int __thiscall
xercesc_4_0::ICUTransService::compareNIString
          (ICUTransService *this,XMLCh *comp1,XMLCh *comp2,XMLSize_t maxChars)

{
  XMLCh *pXVar1;
  XMLCh XVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  XMLSize_t XVar8;
  XMLSize_t XVar9;
  
  if (maxChars == 0) {
    iVar4 = 0;
  }
  else {
    XVar8 = 0;
    XVar9 = 0;
    do {
      XVar2 = comp1[XVar9];
      uVar6 = (uint)(ushort)XVar2;
      if ((XVar2 & 0xfc00U) == 0xd800) {
        lVar3 = XVar9 + 1;
        XVar9 = XVar9 + 2;
        uVar6 = (uint)(ushort)XVar2 * 0x400 + (uint)(ushort)comp1[lVar3] + 0xfca02400;
      }
      else {
        XVar9 = XVar9 + 1;
      }
      pXVar1 = comp2 + XVar8;
      uVar7 = (uint)(ushort)*pXVar1;
      if ((uVar7 & 0xfc00) == 0xd800) {
        lVar3 = XVar8 + 1;
        XVar8 = XVar8 + 2;
        uVar7 = (uint)(ushort)*pXVar1 * 0x400 + (uint)(ushort)comp2[lVar3] + 0xfca02400;
      }
      else {
        XVar8 = XVar8 + 1;
      }
      iVar4 = u_foldCase_70(uVar6,0);
      iVar5 = u_foldCase_70(uVar7);
      if (iVar4 - iVar5 != 0) {
        return iVar4 - iVar5;
      }
      if (XVar9 == maxChars) {
        return -(uint)(XVar8 != maxChars);
      }
    } while (XVar8 != maxChars);
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

int ICUTransService::compareNIString(const  XMLCh* const    comp1
                                    , const XMLCh* const    comp2
                                    , const XMLSize_t       maxChars)
{
    if (maxChars > 0)
    {
        // Note that this function has somewhat broken semantics, as it's
        // possible for two strings of different lengths to compare as equal
        // in a case-insensitive manner, since one character could be
        // represented as a surrogate pair.
        size_t  i = 0;
        size_t  j = 0;

        for(;;)
        {
            UChar32 ch1;
            UChar32 ch2;

            U16_NEXT_UNSAFE(comp1, i, ch1);
            U16_NEXT_UNSAFE(comp2, j, ch2);

            const UChar32   folded1 =
                u_foldCase(ch1, U_FOLD_CASE_DEFAULT);

            const UChar32   folded2 =
                u_foldCase(ch2, U_FOLD_CASE_DEFAULT);

            if (folded1 != folded2)
            {
                return folded1 - folded2;
            }
            else if (i == maxChars)
            {
                // If we're at the end of both strings, return 0.
                // Otherwise, we've run out of characters in the
                // left string, so return -1.
                return j == maxChars ? 0 : -1;
            }
            else if (j == maxChars)
            {
                // We've run out of characters in the right string,
                // but not the left, so return 1.
                return 1;
            }
        }
    }

    return 0;
}